

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFParallelForC.H
# Opt level: O0

enable_if_t<IsFabArray<MultiFab>::value>
amrex::experimental::detail::
ParallelFor<amrex::MultiFab,amrex::MLNodeLaplacian::fixSolvabilityByOffset(int,int,amrex::Any&,amrex::Vector<double,std::allocator<double>>const&)const::__1>
          (MultiFab *mf,IntVect *nghost,IntVect *ts,bool dynamic,anon_class_48_3_6cfc6e41 *f)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  MFItInfo *this;
  byte in_CL;
  IntVect *in_RDX;
  int i;
  int j;
  int k;
  Dim3 hi;
  Dim3 lo;
  int lidx;
  Box *bx;
  MFIter mfi;
  MFIter *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  int iVar4;
  int local_1b8;
  int local_1b4;
  MFItInfo *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  int iVar5;
  int in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  MFIter *in_stack_fffffffffffffe70;
  int iVar6;
  undefined4 in_stack_fffffffffffffe7c;
  int local_16c [7];
  int *local_150;
  MFItInfo local_144;
  MFIter local_130;
  byte local_c1;
  IntVect *local_c0;
  MFIter *local_a8;
  int local_a0;
  int *local_98;
  int local_8c;
  int iStack_88;
  int local_84;
  undefined8 local_80;
  int local_78;
  int *local_70;
  int local_68;
  int iStack_64;
  int local_60;
  undefined4 local_5c;
  int *local_58;
  undefined4 local_4c;
  int *local_48;
  undefined4 local_3c;
  int *local_38;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_c1 = in_CL & 1;
  local_c0 = in_RDX;
  MFItInfo::MFItInfo((MFItInfo *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  this = MFItInfo::EnableTiling(&local_144,local_c0);
  MFItInfo::SetDynamic(this,(bool)(local_c1 & 1));
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 in_stack_fffffffffffffe50);
  while (bVar3 = MFIter::isValid(&local_130), bVar3) {
    in_stack_fffffffffffffe30 = &local_130;
    MFIter::growntilebox
              (in_stack_fffffffffffffe70,
               (IntVect *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    local_150 = local_16c;
    MFIter::LocalIndex(in_stack_fffffffffffffe30);
    local_98 = local_150;
    local_8 = local_150;
    local_c = 0;
    iVar1 = *local_150;
    local_18 = local_150;
    local_1c = 1;
    iVar2 = local_150[1];
    in_stack_fffffffffffffe70 = *(MFIter **)local_150;
    local_28 = local_150;
    local_2c = 2;
    local_1b4 = local_150[2];
    local_70 = local_150;
    local_38 = local_150 + 3;
    local_3c = 0;
    iVar5 = *local_38;
    local_48 = local_150 + 3;
    local_4c = 1;
    in_stack_fffffffffffffe68 = local_150[4];
    local_80 = *(undefined8 *)local_38;
    local_58 = local_150 + 3;
    local_5c = 2;
    in_stack_fffffffffffffe6c = local_150[5];
    iVar6 = local_1b4;
    local_a8 = in_stack_fffffffffffffe70;
    local_a0 = local_1b4;
    local_8c = iVar1;
    iStack_88 = iVar2;
    local_84 = local_1b4;
    local_78 = in_stack_fffffffffffffe6c;
    local_68 = iVar5;
    iStack_64 = in_stack_fffffffffffffe68;
    local_60 = in_stack_fffffffffffffe6c;
    for (; local_1b8 = iVar2, local_1b4 <= in_stack_fffffffffffffe6c; local_1b4 = local_1b4 + 1) {
      for (; iVar4 = iVar1, local_1b8 <= in_stack_fffffffffffffe68; local_1b8 = local_1b8 + 1) {
        for (; iVar4 <= iVar5; iVar4 = iVar4 + 1) {
          MLNodeLaplacian::fixSolvabilityByOffset::anon_class_48_3_6cfc6e41::operator()
                    ((anon_class_48_3_6cfc6e41 *)CONCAT44(in_stack_fffffffffffffe7c,iVar6),
                     (int)((ulong)in_stack_fffffffffffffe70 >> 0x20),(int)in_stack_fffffffffffffe70,
                     in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
        }
      }
    }
    MFIter::operator++(&local_130);
  }
  MFIter::~MFIter(in_stack_fffffffffffffe30);
  return;
}

Assistant:

std::enable_if_t<IsFabArray<MF>::value>
ParallelFor (MF const& mf, IntVect const& nghost, IntVect const& ts, bool dynamic, F&& f)
{
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
    for (MFIter mfi(mf,MFItInfo().EnableTiling(ts).SetDynamic(dynamic)); mfi.isValid(); ++mfi) {
        Box const& bx = mfi.growntilebox(nghost);
        int const lidx = mfi.LocalIndex();
        const auto lo = amrex::lbound(bx);
        const auto hi = amrex::ubound(bx);
        for (        int k = lo.z; k <= hi.z; ++k) {
            for (    int j = lo.y; j <= hi.y; ++j) {
                AMREX_PRAGMA_SIMD
                for (int i = lo.x; i <= hi.x; ++i) {
                    f(lidx,i,j,k);
                }
            }
        }
    }
}